

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_gcd(__mpz_struct *g,__mpz_struct *u,__mpz_struct *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 uVar4;
  mp_limb_t *pmVar5;
  int iVar6;
  mp_bitcnt_t mVar7;
  mp_bitcnt_t bits;
  ulong *puVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  __mpz_struct *u_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __mpz_struct local_48;
  __mpz_struct local_38;
  
  u_00 = v;
  if ((u->_mp_size == 0) || (u_00 = u, v->_mp_size == 0)) {
    mpz_abs(g,u_00);
    return;
  }
  local_38._mp_alloc = 0;
  local_38._mp_size = 0;
  local_38._mp_d = &mpz_init::dummy_limb;
  local_48._mp_alloc = 0;
  local_48._mp_size = 0;
  local_48._mp_d = &mpz_init::dummy_limb;
  mpz_abs(&local_38,u);
  mVar7 = mpz_make_odd(&local_38);
  mpz_abs(&local_48,v);
  bits = mpz_make_odd(&local_48);
  pmVar5 = local_38._mp_d;
  if (mVar7 < bits) {
    bits = mVar7;
  }
  bVar3 = local_38._mp_size < local_48._mp_size;
  if (bVar3) {
    local_38._mp_d = local_48._mp_d;
    local_48._mp_d = pmVar5;
    uVar4._0_4_ = local_48._mp_alloc;
    uVar4._4_4_ = local_48._mp_size;
    local_48._mp_alloc = local_38._mp_alloc;
    local_48._mp_size = local_38._mp_size;
    local_38._0_8_ = uVar4;
  }
  mpz_tdiv_r(&local_38,&local_38,&local_48);
  if (local_38._mp_size == 0) {
    puVar8 = g->_mp_d;
    g->_mp_d = local_48._mp_d;
    uVar1._0_4_ = g->_mp_alloc;
    uVar1._4_4_ = g->_mp_size;
    g->_mp_alloc = local_48._mp_alloc;
    g->_mp_size = local_48._mp_size;
    local_48._0_8_ = uVar1;
    local_48._mp_d = puVar8;
  }
  else {
    while( true ) {
      mpz_make_odd(&local_38);
      iVar6 = mpz_cmp(&local_38,&local_48);
      pmVar5 = local_38._mp_d;
      uVar4 = local_38._0_8_;
      if (iVar6 == 0) break;
      if (iVar6 < 0) {
        local_38._mp_d = local_48._mp_d;
        local_48._mp_d = pmVar5;
        iVar6 = local_38._mp_size;
        local_38._mp_alloc = local_48._mp_alloc;
        local_38._mp_size = local_48._mp_size;
        uVar1 = local_38._0_8_;
        local_38._mp_alloc = (int)uVar4;
        local_38._mp_size = SUB84(uVar4,4);
        local_48._mp_alloc = local_38._mp_alloc;
        local_48._mp_size = local_38._mp_size;
        local_38._0_8_ = uVar1;
      }
      else {
        iVar6 = local_48._mp_size;
      }
      if (iVar6 == 1) {
        mpz_tdiv_r(&local_38,&local_38,&local_48);
        if (g->_mp_alloc < 1) {
          puVar8 = mpz_realloc(g,1);
        }
        else {
          puVar8 = g->_mp_d;
        }
        uVar10 = *local_38._mp_d;
        uVar12 = *local_48._mp_d;
        uVar13 = uVar12;
        if ((uVar10 != 0) && (uVar13 = uVar10, uVar12 != 0)) {
          uVar13 = 0x3f;
          for (uVar11 = -(uVar12 | uVar10) & (uVar12 | uVar10); uVar11 >> 0x38 == 0;
              uVar11 = uVar11 << 8) {
            uVar13 = (ulong)((int)uVar13 - 8);
          }
          for (; -1 < (long)uVar11; uVar11 = uVar11 * 2) {
            uVar13 = (ulong)((int)uVar13 - 1);
          }
          bVar9 = (byte)uVar13;
          uVar14 = uVar10 >> (bVar9 & 0x3f);
          uVar12 = uVar12 >> (bVar9 & 0x3f);
          uVar11 = uVar12;
          if ((uVar10 >> (uVar13 & 0x3f) & 1) == 0) {
            uVar11 = uVar14;
          }
          do {
            uVar13 = uVar11;
            uVar11 = uVar13 >> 1;
          } while ((uVar13 & 1) == 0);
          if ((uVar14 & 1) != 0) {
            uVar12 = uVar14;
          }
          while( true ) {
            uVar10 = uVar12 - uVar13;
            if (uVar10 == 0) break;
            if (uVar12 < uVar13 || uVar10 == 0) {
              uVar10 = uVar13 - uVar12;
              do {
                uVar13 = uVar10 >> 1;
                uVar11 = uVar10 & 2;
                uVar10 = uVar13;
              } while (uVar11 == 0);
            }
            else {
              do {
                uVar12 = uVar10 >> 1;
                uVar11 = uVar10 & 2;
                uVar10 = uVar12;
              } while (uVar11 == 0);
            }
          }
          uVar13 = uVar13 << (bVar9 & 0x3f);
        }
        *puVar8 = uVar13;
        g->_mp_size = (uint)(uVar13 != 0);
        goto LAB_0049d5ef;
      }
      mpz_sub(&local_38,&local_38,&local_48);
    }
    puVar8 = g->_mp_d;
    g->_mp_d = local_38._mp_d;
    uVar2._0_4_ = g->_mp_alloc;
    uVar2._4_4_ = g->_mp_size;
    g->_mp_alloc = local_38._mp_alloc;
    g->_mp_size = local_38._mp_size;
    local_38._0_8_ = uVar2;
    local_38._mp_d = puVar8;
  }
LAB_0049d5ef:
  if ((long)local_38._mp_alloc != 0) {
    (*gmp_free_func)(local_38._mp_d,(long)local_38._mp_alloc << 3);
  }
  if ((long)local_48._mp_alloc != 0) {
    (*gmp_free_func)(local_48._mp_d,(long)local_48._mp_alloc << 3);
  }
  mpz_mul_2exp(g,g,bits);
  return;
}

Assistant:

void
mpz_gcd (mpz_t g, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv;
  mp_bitcnt_t uz, vz, gz;

  if (u->_mp_size == 0)
    {
      mpz_abs (g, v);
      return;
    }
  if (v->_mp_size == 0)
    {
      mpz_abs (g, u);
      return;
    }

  mpz_init (tu);
  mpz_init (tv);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  if (tu->_mp_size < tv->_mp_size)
    mpz_swap (tu, tv);

  mpz_tdiv_r (tu, tu, tv);
  if (tu->_mp_size == 0)
    {
      mpz_swap (g, tv);
    }
  else
    for (;;)
      {
	int c;

	mpz_make_odd (tu);
	c = mpz_cmp (tu, tv);
	if (c == 0)
	  {
	    mpz_swap (g, tu);
	    break;
	  }
	if (c < 0)
	  mpz_swap (tu, tv);

	if (tv->_mp_size == 1)
	  {
	    mp_limb_t *gp;

	    mpz_tdiv_r (tu, tu, tv);
	    gp = MPZ_REALLOC (g, 1); /* gp = mpz_limbs_modify (g, 1); */
	    *gp = mpn_gcd_11 (tu->_mp_d[0], tv->_mp_d[0]);

	    g->_mp_size = *gp != 0; /* mpz_limbs_finish (g, 1); */
	    break;
	  }
	mpz_sub (tu, tu, tv);
      }
  mpz_clear (tu);
  mpz_clear (tv);
  mpz_mul_2exp (g, g, gz);
}